

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.cc
# Opt level: O1

bool __thiscall
sptk::MedianFilter::Get(MedianFilter *this,vector<double,_std::allocator<double>_> *output)

{
  double *pdVar1;
  bool bVar2;
  _Elt_pointer pvVar3;
  pointer pdVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  bool bVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> *input_vector;
  _Elt_pointer pvVar7;
  int num;
  _Map_pointer ppvVar8;
  _Elt_pointer pvVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  _Iter_less_iter local_41;
  vector<double,_std::allocator<double>_> *local_40;
  size_type local_38;
  
  bVar5 = false;
  if ((output != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar5 = false, this->is_valid_ != false)) {
    local_40 = output;
    bVar5 = Forward(this);
    if (bVar5) {
      iVar6 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
      local_38 = (size_type)iVar6;
      if ((long)(local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != local_38) {
        std::vector<double,_std::allocator<double>_>::resize(local_40,local_38);
      }
      if (0 < iVar6) {
        uVar14 = 0;
        do {
          pvVar7 = (this->queue_).
                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          pvVar3 = (this->queue_).
                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          num = 0;
          iVar6 = 0;
          if (pvVar7 != pvVar3) {
            ppvVar8 = (this->queue_).
                      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
            pvVar9 = (this->queue_).
                     super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
            bVar5 = this->apply_each_dimension_;
            bVar2 = this->use_magic_number_;
            iVar6 = 0;
            uVar10 = 0;
            if (bVar5 != false) {
              uVar10 = uVar14 & 0xffffffff;
            }
            num = 0;
            do {
              if ((bVar5 != false) || ((int)uVar10 <= this->num_input_order_)) {
                pdVar4 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar11 = uVar10 - 1;
                do {
                  if ((((bVar2 & 1U) == 0) ||
                      (pdVar1 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar11 + 1,
                      this->magic_number_ != *pdVar1)) || (NAN(this->magic_number_) || NAN(*pdVar1))
                     ) {
                    lVar13 = (long)num;
                    num = num + 1;
                    pdVar4[lVar13] =
                         (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar11 + 1];
                  }
                  else {
                    iVar6 = iVar6 + 1;
                  }
                  iVar12 = (int)uVar14;
                  if (bVar5 == false) {
                    iVar12 = this->num_input_order_;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < iVar12);
              }
              pvVar7 = pvVar7 + 1;
              if (pvVar7 == pvVar9) {
                pvVar7 = ppvVar8[1];
                ppvVar8 = ppvVar8 + 1;
                pvVar9 = pvVar7 + 0x15;
              }
            } while (pvVar7 != pvVar3);
          }
          if (num < iVar6) {
            dVar15 = this->magic_number_;
          }
          else {
            __first._M_current =
                 (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
            lVar11 = (long)(num / 2);
            std::
            __heap_select<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__first._M_current,__first._M_current + lVar11 + 1,__first._M_current + num);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__first,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                )(__first._M_current + lVar11 + 1),&local_41);
            bVar5 = IsEven(num);
            pdVar4 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (bVar5) {
              dVar15 = (pdVar4[lVar11 + -1] + pdVar4[lVar11]) * 0.5;
            }
            else {
              dVar15 = pdVar4[lVar11];
            }
          }
          (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar14] = dVar15;
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_38);
      }
      if ((this->count_down_ < this->num_filter_order_ / 2) ||
         (ppvVar8 = (this->queue_).
                    super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node, bVar5 = true,
         this->num_filter_order_ <
         (int)((int)((ulong)((long)(this->queue_).
                                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)(this->queue_).
                                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
               -0x55555555 +
               (int)((ulong)((long)(this->queue_).
                                   super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)(this->queue_).
                                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
               -0x55555555 +
              ((int)((ulong)((long)ppvVar8 -
                            (long)(this->queue_).
                                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppvVar8 == (_Map_pointer)0x0)) * 0x15))) {
        std::
        deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::pop_front(&this->queue_);
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool MedianFilter::Get(std::vector<double>* output) {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  if (!Forward()) {
    return false;
  }

  const int output_size(GetSize());
  if (output->size() != static_cast<std::size_t>(output_size)) {
    output->resize(output_size);
  }

  for (int m(0); m < output_size; ++m) {
    int num_magic_numbers(0);
    int num_valid_numbers(0);
    for (const std::vector<double>& input_vector : queue_) {
      for (int n(apply_each_dimension_ ? m : 0);
           n <= (apply_each_dimension_ ? m : num_input_order_); ++n) {
        if (use_magic_number_ && magic_number_ == input_vector[n]) {
          ++num_magic_numbers;
        } else {
          flat_[num_valid_numbers++] = input_vector[n];
        }
      }
    }

    if (num_valid_numbers < num_magic_numbers) {
      (*output)[m] = magic_number_;
      continue;
    }

    const int half_size(num_valid_numbers / 2);
    std::partial_sort(flat_.begin(), flat_.begin() + half_size + 1,
                      flat_.begin() + num_valid_numbers);
    if (IsEven(num_valid_numbers)) {
      (*output)[m] = 0.5 * (flat_[half_size - 1] + flat_[half_size]);
    } else {
      (*output)[m] = flat_[half_size];
    }
  }

  if (count_down_ < num_filter_order_ / 2 ||
      num_filter_order_ + 1 <= static_cast<int>(queue_.size())) {
    queue_.pop_front();
  }

  return true;
}